

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

bool __thiscall tlx::CmdlineParser::process(CmdlineParser *this,int argc,char **argv,ostream *os)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *__lhs;
  reference ppAVar6;
  ostream *poVar7;
  void *pvVar8;
  size_t sVar9;
  reference ppAVar10;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_140;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_138;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_130;
  const_iterator it;
  undefined1 local_120 [7];
  bool good;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_100;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_f8;
  string local_f0;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_d0;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_c8;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_c0;
  const_iterator oi_1;
  int old_argc;
  size_t arg_length;
  size_t offset;
  string local_88;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_68;
  __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_60;
  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
  local_58;
  const_iterator oi;
  char *arg;
  iterator iStack_40;
  bool end_optlist;
  iterator argi;
  int i;
  ostream *os_local;
  char **argv_local;
  CmdlineParser *pCStack_18;
  int argc_local;
  CmdlineParser *this_local;
  
  this->program_name_ = *argv;
  argv_local._4_4_ = argc + -1;
  os_local = (ostream *)(argv + 1);
  pCStack_18 = this;
  for (argi._M_current._4_4_ = 0; argi._M_current._4_4_ < argv_local._4_4_;
      argi._M_current._4_4_ = argi._M_current._4_4_ + 1) {
    iVar4 = strcmp(*(char **)(os_local + (long)argi._M_current._4_4_ * 8),"-h");
    if ((iVar4 == 0) ||
       (iVar4 = strcmp(*(char **)(os_local + (long)argi._M_current._4_4_ * 8),"--help"), iVar4 == 0)
       ) {
      print_usage(this,os);
      return false;
    }
  }
  iStack_40 = std::
              vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ::begin(&this->param_list_);
  bVar3 = false;
LAB_001b34cc:
  do {
    while( true ) {
      while( true ) {
        if (argv_local._4_4_ == 0) {
          it._M_current._7_1_ = 1;
          local_138._M_current =
               (Argument **)
               std::
               vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ::begin(&this->param_list_);
          __gnu_cxx::
          __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
          ::__normal_iterator<tlx::CmdlineParser::Argument**>
                    ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                      *)&local_130,&local_138);
          while( true ) {
            local_140._M_current =
                 (Argument **)
                 std::
                 vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                 ::end(&this->param_list_);
            bVar3 = __gnu_cxx::operator!=(&local_130,&local_140);
            if (!bVar3) break;
            ppAVar6 = __gnu_cxx::
                      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                      ::operator*(&local_130);
            if ((((*ppAVar6)->required_ & 1U) != 0) &&
               (ppAVar6 = __gnu_cxx::
                          __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          ::operator*(&local_130), ((*ppAVar6)->found_ & 1U) == 0)) {
              poVar7 = std::operator<<(os,"Error: argument for parameter ");
              ppAVar6 = __gnu_cxx::
                        __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                        ::operator*(&local_130);
              poVar7 = std::operator<<(poVar7,(string *)&(*ppAVar6)->longkey_);
              poVar7 = std::operator<<(poVar7," is required!");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              it._M_current._7_1_ = 0;
            }
            __gnu_cxx::
            __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
            ::operator++(&local_130);
          }
          if ((it._M_current._7_1_ & 1) == 0) {
            std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
            print_usage(this,os);
          }
          return (bool)(it._M_current._7_1_ & 1);
        }
        oi._M_current = *(Argument ***)os_local;
        if ((*(char *)oi._M_current == '-') && (!bVar3)) break;
        local_100._M_current =
             (Argument **)
             std::
             vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
             ::end(&this->param_list_);
        bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffc0,&local_100);
        if (!bVar2) {
          poVar7 = std::operator<<(os,"Error: unexpected extra argument ");
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7,*(char **)os_local);
          poVar7 = std::operator<<(poVar7,"\".");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = argv_local._4_4_ + -1;
          os_local = os_local + 8;
          print_usage(this,os);
          return false;
        }
        ppAVar10 = __gnu_cxx::
                   __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                   ::operator*(&stack0xffffffffffffffc0);
        uVar5 = (*(*ppAVar10)->_vptr_Argument[3])(*ppAVar10,(long)&argv_local + 4,&os_local);
        iVar4 = argv_local._4_4_;
        poVar7 = os_local;
        if ((uVar5 & 1) == 0) {
          ppAVar10 = __gnu_cxx::
                     __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                     ::operator*(&stack0xffffffffffffffc0);
          print_param_error(this,iVar4,(char **)poVar7,*ppAVar10,os);
          return false;
        }
        if ((this->verbose_process_ & 1U) != 0) {
          poVar7 = std::operator<<(os,"Parameter ");
          ppAVar10 = __gnu_cxx::
                     __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                     ::operator*(&stack0xffffffffffffffc0);
          Argument::param_text_abi_cxx11_((string *)local_120,*ppAVar10);
          poVar7 = std::operator<<(poVar7,(string *)local_120);
          std::operator<<(poVar7," set to ");
          std::__cxx11::string::~string((string *)local_120);
          ppAVar10 = __gnu_cxx::
                     __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                     ::operator*(&stack0xffffffffffffffc0);
          (*(*ppAVar10)->_vptr_Argument[4])(*ppAVar10,os);
          poVar7 = std::operator<<(os,'.');
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        ppAVar10 = __gnu_cxx::
                   __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                   ::operator*(&stack0xffffffffffffffc0);
        (*ppAVar10)->found_ = true;
        ppAVar10 = __gnu_cxx::
                   __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                   ::operator*(&stack0xffffffffffffffc0);
        if (((*ppAVar10)->repeated_ & 1U) == 0) {
          __gnu_cxx::
          __normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
          ::operator++(&stack0xffffffffffffffc0);
        }
      }
      argv_local._4_4_ = argv_local._4_4_ + -1;
      os_local = os_local + 8;
      if (*(char *)((long)oi._M_current + 1) == '-') break;
      if (*(char *)((long)oi._M_current + 1) == '\0') {
        poVar7 = std::operator<<(os,"Invalid option \"");
        poVar7 = std::operator<<(poVar7,(char *)oi._M_current);
        poVar7 = std::operator<<(poVar7,"\".");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      else {
        arg_length = 1;
        sVar9 = strlen((char *)oi._M_current);
        oi_1._M_current._4_4_ = argv_local._4_4_;
        while (arg_length < sVar9 && argv_local._4_4_ == oi_1._M_current._4_4_) {
          local_c8._M_current =
               (Argument **)
               std::
               vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ::begin(&this->option_list_);
          __gnu_cxx::
          __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
          ::__normal_iterator<tlx::CmdlineParser::Argument**>
                    ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                      *)&local_c0,&local_c8);
          while( true ) {
            local_d0._M_current =
                 (Argument **)
                 std::
                 vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                 ::end(&this->option_list_);
            bVar2 = __gnu_cxx::operator!=(&local_c0,&local_d0);
            if (!bVar2) break;
            cVar1 = *(char *)((long)oi._M_current + arg_length);
            ppAVar6 = __gnu_cxx::
                      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                      ::operator*(&local_c0);
            if (cVar1 == (*ppAVar6)->key_) {
              arg_length = arg_length + 1;
              ppAVar6 = __gnu_cxx::
                        __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                        ::operator*(&local_c0);
              uVar5 = (*(*ppAVar6)->_vptr_Argument[3])(*ppAVar6,(long)&argv_local + 4,&os_local);
              iVar4 = argv_local._4_4_;
              poVar7 = os_local;
              if ((uVar5 & 1) == 0) {
                ppAVar6 = __gnu_cxx::
                          __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          ::operator*(&local_c0);
                print_option_error(this,iVar4,(char **)poVar7,*ppAVar6,os);
                return false;
              }
              if ((this->verbose_process_ & 1U) != 0) {
                poVar7 = std::operator<<(os,"Option ");
                ppAVar6 = __gnu_cxx::
                          __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          ::operator*(&local_c0);
                Argument::option_text_abi_cxx11_(&local_f0,*ppAVar6);
                poVar7 = std::operator<<(poVar7,(string *)&local_f0);
                std::operator<<(poVar7," set to ");
                std::__cxx11::string::~string((string *)&local_f0);
                ppAVar6 = __gnu_cxx::
                          __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                          ::operator*(&local_c0);
                (*(*ppAVar6)->_vptr_Argument[4])(*ppAVar6,os);
                poVar7 = std::operator<<(os,'.');
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              break;
            }
            __gnu_cxx::
            __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
            ::operator++(&local_c0);
          }
          local_f8._M_current =
               (Argument **)
               std::
               vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ::end(&this->option_list_);
          bVar2 = __gnu_cxx::operator==(&local_c0,&local_f8);
          if (bVar2) {
            std::operator<<(os,"Error: unknown option \"");
            if (2 < sVar9) {
              poVar7 = std::operator<<(os,"-");
              poVar7 = std::operator<<(poVar7,*(char *)((long)oi._M_current + arg_length));
              poVar7 = std::operator<<(poVar7,"\" at position ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,arg_length);
              std::operator<<(poVar7," in option sequence \"");
            }
            poVar7 = std::operator<<(os,(char *)oi._M_current);
            poVar7 = std::operator<<(poVar7,"\".");
            pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>)
            ;
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            print_usage(this,os);
            return false;
          }
        }
      }
    }
    if (*(char *)((long)oi._M_current + 2) == '-') {
      bVar3 = true;
      goto LAB_001b34cc;
    }
    local_60._M_current =
         (Argument **)
         std::
         vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
         begin(&this->option_list_);
    __gnu_cxx::
    __normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
    ::__normal_iterator<tlx::CmdlineParser::Argument**>
              ((__normal_iterator<tlx::CmdlineParser::Argument*const*,std::vector<tlx::CmdlineParser::Argument*,std::allocator<tlx::CmdlineParser::Argument*>>>
                *)&local_58,&local_60);
    while( true ) {
      local_68._M_current =
           (Argument **)
           std::
           vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>::
           end(&this->option_list_);
      bVar2 = __gnu_cxx::operator!=(&local_58,&local_68);
      if (!bVar2) break;
      __lhs = (char *)((long)oi._M_current + 2);
      ppAVar6 = __gnu_cxx::
                __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                ::operator*(&local_58);
      bVar2 = std::operator==(__lhs,&(*ppAVar6)->longkey_);
      if (bVar2) {
        ppAVar6 = __gnu_cxx::
                  __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                  ::operator*(&local_58);
        uVar5 = (*(*ppAVar6)->_vptr_Argument[3])(*ppAVar6,(long)&argv_local + 4,&os_local);
        iVar4 = argv_local._4_4_;
        poVar7 = os_local;
        if ((uVar5 & 1) == 0) {
          ppAVar6 = __gnu_cxx::
                    __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                    ::operator*(&local_58);
          print_option_error(this,iVar4,(char **)poVar7,*ppAVar6,os);
          return false;
        }
        if ((this->verbose_process_ & 1U) != 0) {
          poVar7 = std::operator<<(os,"Option ");
          ppAVar6 = __gnu_cxx::
                    __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                    ::operator*(&local_58);
          Argument::option_text_abi_cxx11_(&local_88,*ppAVar6);
          poVar7 = std::operator<<(poVar7,(string *)&local_88);
          std::operator<<(poVar7," set to ");
          std::__cxx11::string::~string((string *)&local_88);
          ppAVar6 = __gnu_cxx::
                    __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                    ::operator*(&local_58);
          (*(*ppAVar6)->_vptr_Argument[4])(*ppAVar6,os);
          poVar7 = std::operator<<(os,'.');
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<tlx::CmdlineParser::Argument_*const_*,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
      ::operator++(&local_58);
    }
    offset = (size_t)std::
                     vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                     ::end(&this->option_list_);
    bVar2 = __gnu_cxx::operator==
                      (&local_58,
                       (__normal_iterator<tlx::CmdlineParser::Argument_**,_std::vector<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>_>
                        *)&offset);
    if (bVar2) {
      poVar7 = std::operator<<(os,"Error: unknown option \"");
      poVar7 = std::operator<<(poVar7,(char *)oi._M_current);
      poVar7 = std::operator<<(poVar7,"\".");
      pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      print_usage(this,os);
      return false;
    }
  } while( true );
}

Assistant:

bool CmdlineParser::process(
    int argc, const char* const* argv, std::ostream& os) {
    program_name_ = argv[0];
    --argc, ++argv;

    // search for help string and output help
    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "-h") == 0 || strcmp(argv[i], "--help") == 0) {
            print_usage(os);
            return false;
        }
    }

    // current argument in param_list_
    ArgumentList::iterator argi = param_list_.begin();
    bool end_optlist = false;

    while (argc != 0) {
        const char* arg = argv[0];

        if (arg[0] == '-' && !end_optlist) {
            // option, advance to argument
            --argc, ++argv;
            if (arg[1] == '-') {
                if (arg[2] == '-') {
                    end_optlist = true;
                }
                else {
                    // long option
                    ArgumentList::const_iterator oi = option_list_.begin();
                    for ( ; oi != option_list_.end(); ++oi) {
                        if ((arg + 2) == (*oi)->longkey_) {
                            if (!(*oi)->process(argc, argv)) {
                                print_option_error(argc, argv, *oi, os);
                                return false;
                            }
                            else if (verbose_process_) {
                                os << "Option " << (*oi)->option_text()
                                   << " set to ";
                                (*oi)->print_value(os);
                                os << '.' << std::endl;
                            }
                            break;
                        }
                    }
                    if (oi == option_list_.end()) {
                        os << "Error: unknown option \"" << arg << "\"."
                           << std::endl << std::endl;
                        print_usage(os);
                        return false;
                    }
                }
            }
            else {
                // short option
                if (arg[1] == 0) {
                    os << "Invalid option \"" << arg << "\"." << std::endl;
                }
                else {
                    size_t offset = 1, arg_length = strlen(arg);
                    int old_argc = argc;
                    // Arguments will increase argc, so abort if it increases,
                    // while flags won't, so increase offset and parse next
                    while (offset < arg_length && argc == old_argc) {
                        ArgumentList::const_iterator oi = option_list_.begin();
                        for ( ; oi != option_list_.end(); ++oi) {
                            if (arg[offset] == (*oi)->key_) {
                                ++offset;
                                if (!(*oi)->process(argc, argv)) {
                                    print_option_error(argc, argv, *oi, os);
                                    return false;
                                }
                                else if (verbose_process_) {
                                    os << "Option "
                                       << (*oi)->option_text()
                                       << " set to ";
                                    (*oi)->print_value(os);
                                    os << '.' << std::endl;
                                }
                                break;
                            }
                        }
                        if (oi == option_list_.end()) {
                            os << "Error: unknown option \"";
                            if (arg_length > 2) {
                                // multiple short options combined
                                os << "-" << arg[offset]
                                   << "\" at position " << offset
                                   << " in option sequence \"";
                            }
                            os << arg << "\"." << std::endl << std::endl;
                            print_usage(os);
                            return false;
                        }
                    }
                }
            }
        }
        else {
            if (argi != param_list_.end()) {
                if (!(*argi)->process(argc, argv)) {
                    print_param_error(argc, argv, *argi, os);
                    return false;
                }
                else if (verbose_process_) {
                    os << "Parameter " << (*argi)->param_text() << " set to ";
                    (*argi)->print_value(os);
                    os << '.' << std::endl;
                }
                (*argi)->found_ = true;
                if (!(*argi)->repeated_)
                    ++argi;
            }
            else {
                os << "Error: unexpected extra argument "
                   << "\"" << argv[0] << "\"." << std::endl << std::endl;
                --argc, ++argv;
                print_usage(os);
                return false;
            }
        }
    }

    bool good = true;

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        if ((*it)->required_ && !(*it)->found_) {
            os << "Error: argument for parameter " << (*it)->longkey_
               << " is required!" << std::endl;
            good = false;
        }
    }

    if (!good) {
        os << std::endl;
        print_usage(os);
    }

    return good;
}